

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O0

void __thiscall soplex::SPxOut::SPxOut(SPxOut *this,SPxOut *rhs)

{
  undefined8 uVar1;
  long in_RSI;
  undefined8 *in_RDI;
  int i;
  int local_14;
  
  *in_RDI = &PTR__SPxOut_008a1be8;
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 8);
  in_RDI[2] = 0;
  spx_alloc<std::ostream**>((basic_ostream<char,_std::char_traits<char>_> ***)this,rhs._4_4_);
  in_RDI[2] = in_RDI[2];
  uVar1 = **(undefined8 **)(in_RSI + 0x10);
  *(undefined8 *)(in_RDI[2] + 8) = uVar1;
  *(undefined8 *)in_RDI[2] = uVar1;
  for (local_14 = 2; local_14 < 6; local_14 = local_14 + 1) {
    *(undefined8 *)(in_RDI[2] + (long)local_14 * 8) =
         *(undefined8 *)(*(long *)(in_RSI + 0x10) + (long)local_14 * 8);
  }
  return;
}

Assistant:

SPxOut::SPxOut(const SPxOut& rhs)
{
   m_verbosity = rhs.m_verbosity;
   m_streams = nullptr;
   spx_alloc(m_streams, INFO3 + 1);
   m_streams = new(m_streams) std::ostream*[INFO3 + 1];
   m_streams[ ERROR ] = m_streams[ WARNING ] = rhs.m_streams[ERROR];

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = rhs.m_streams[ i ];
}